

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O3

string * __thiscall
tinyusdz::print_typed_attr<std::array<float,4ul>>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttributeWithFallback<std::array<float,_4UL>_> *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  long lVar5;
  uint32_t uVar6;
  string *psVar7;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  tinyusdz *v;
  stringstream ss;
  string local_208;
  TypedAttributeWithFallback<std::array<float,_4UL>_> *local_1e8;
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  psVar7 = name;
  local_1e8 = attr;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  if ((((this[0x234] == (tinyusdz)0x0) && (this[0x220] == (tinyusdz)0x0)) &&
      (*(long *)(this + 0x210) == *(long *)(this + 0x208))) && (this[0x248] != (tinyusdz)0x1))
  goto LAB_002f8088;
  bVar2 = AttrMetas::authored((AttrMetas *)this);
  if ((bVar2) || (this[0x248] != (tinyusdz)0x0)) {
LAB_002f7d2d:
    uVar6 = (uint32_t)psVar7;
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)name & 0xffffffff),n);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                 local_208.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    local_208.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_208.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_208._M_string_length = 6;
    local_208.field_2._M_local_buf[6] = '\0';
    local_208._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)(local_1e8->_metas).interpolation,
               (long)(local_1e8->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                 local_208.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    if (this[0x248] == (tinyusdz)0x1) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
    }
    else {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
      v = this + 0x238;
      if (this[0x220] != (tinyusdz)0x0) {
        v = this + 0x224;
      }
      ::std::operator<<(local_1a8,(float4 *)v);
    }
    bVar2 = AttrMetas::authored((AttrMetas *)this);
    if (bVar2) {
      local_1e0 = __return_storage_ptr__;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," (\n",3);
      print_attr_metas_abi_cxx11_(&local_208,this,(AttrMeta *)(ulong)((int)name + 1),uVar6);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
      pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)name & 0xffffffff),n_00);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      __return_storage_ptr__ = local_1e0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT17(local_208.field_2._M_local_buf[7],
                                 CONCAT16(local_208.field_2._M_local_buf[6],
                                          CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                   local_208.field_2._M_allocated_capacity._0_4_)))
                        + 1);
        __return_storage_ptr__ = local_1e0;
      }
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    psVar4 = *(string **)(this + 0x208);
    psVar7 = *(string **)(this + 0x210);
    uVar6 = extraout_EDX;
  }
  else {
    psVar4 = *(string **)(this + 0x208);
    psVar7 = *(string **)(this + 0x210);
    if ((psVar7 == psVar4) || (uVar6 = n, ((byte)this[0x234] & 1) == 0)) goto LAB_002f7d2d;
  }
  if (psVar7 != psVar4) {
    pprint::Indent_abi_cxx11_(&local_208,(pprint *)((ulong)name & 0xffffffff),uVar6);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,local_208._M_dataplus._M_p,local_208._M_string_length);
    paVar1 = &local_208.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                 local_208.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"uniform ",8);
    local_208.field_2._M_allocated_capacity._0_4_ = 0x616f6c66;
    local_208.field_2._M_allocated_capacity._4_2_ = 0x3474;
    local_208._M_string_length = 6;
    local_208.field_2._M_local_buf[6] = '\0';
    local_208._M_dataplus._M_p = (pointer)paVar1;
    poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,paVar1->_M_local_buf,6);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(char *)(local_1e8->_metas).interpolation,
               (long)(local_1e8->_metas).elementSize);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != paVar1) {
      operator_delete(local_208._M_dataplus._M_p,
                      CONCAT17(local_208.field_2._M_local_buf[7],
                               CONCAT16(local_208.field_2._M_local_buf[6],
                                        CONCAT24(local_208.field_2._M_allocated_capacity._4_2_,
                                                 local_208.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
    lVar5 = (*(long *)(this + 0x210) - (long)*(Path **)(this + 0x208) >> 4) * 0x4ec4ec4ec4ec4ec5;
    if (lVar5 == 0) {
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
    }
    else if (lVar5 == 1) {
      ::std::operator<<(local_1a8,*(Path **)(this + 0x208));
    }
    else {
      ::std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x208));
    }
  }
LAB_002f8088:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttributeWithFallback<T> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    // default
    if (attr.metas().authored() || attr.is_blocked() || (!attr.is_connection())) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else {
        ss << " = " << attr.get_value();
      }

      if (attr.metas().authored()) {
        ss << " (\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    if (attr.has_connections()) {
      ss << pprint::Indent(indent);
      ss << "uniform ";
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".connect = ";

      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
    }
  }

  return ss.str();
}